

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O0

bool presolve::dev_kkt_check::checkKkt(State *state,KktInfo *info)

{
  ostream *this;
  mapped_type *pmVar1;
  KktConditionDetails *in_RSI;
  State *in_RDI;
  State *in_stack_00000070;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  bool local_1;
  
  if (in_RDI->numCol == 0) {
    this = std::operator<<((ostream *)&std::cout,"KKT warning: empty problem");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_1 = true;
  }
  else {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    uVar5 = 0;
    std::
    map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
    ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    checkPrimalBounds((State *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),
                      (KktConditionDetails *)
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::
    map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
    ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    checkPrimalFeasMatrix(in_RDI,in_RSI);
    std::
    map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
    ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    checkDualFeasibility(in_stack_00000070,(KktConditionDetails *)state);
    std::
    map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
    ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    checkComplementarySlackness(in_RDI,in_RSI);
    uVar4 = 4;
    std::
    map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
    ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                  *)CONCAT44(4,in_stack_ffffffffffffffd0),
                 (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    checkStationarityOfLagrangian(in_RDI,in_RSI);
    uVar3 = 5;
    std::
    map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
    ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                  *)CONCAT44(uVar4,5),
                 (key_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    checkBasicFeasibleSolution
              ((State *)CONCAT44(uVar4,uVar3),
               (KktConditionDetails *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
    ;
    uVar2 = 0;
    pmVar1 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                           *)CONCAT44(uVar4,uVar3),(key_type *)(ulong)in_stack_ffffffffffffffc8);
    *(bool *)&in_RSI[1].sum_violation_2 = pmVar1->violated == 0;
    uVar5 = 1;
    pmVar1 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                           *)CONCAT44(uVar4,uVar3),(key_type *)CONCAT44(uVar2,1));
    *(bool *)((long)&in_RSI[1].sum_violation_2 + 1) = pmVar1->violated == 0;
    pmVar1 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                           *)CONCAT44(uVar4,uVar3),(key_type *)CONCAT44(uVar2,uVar5));
    *(bool *)((long)&in_RSI[1].sum_violation_2 + 2) = pmVar1->violated == 0;
    pmVar1 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                           *)CONCAT44(uVar4,uVar3),(key_type *)CONCAT44(uVar2,uVar5));
    *(bool *)((long)&in_RSI[1].sum_violation_2 + 4) = pmVar1->violated == 0;
    pmVar1 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                           *)CONCAT44(uVar4,uVar3),(key_type *)CONCAT44(uVar2,uVar5));
    *(bool *)((long)&in_RSI[1].sum_violation_2 + 3) = pmVar1->violated == 0;
    pmVar1 = std::
             map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
             ::operator[]((map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
                           *)CONCAT44(uVar4,uVar3),(key_type *)CONCAT44(uVar2,uVar5));
    *(bool *)((long)&in_RSI[1].sum_violation_2 + 5) = pmVar1->violated == 0;
    if ((((((ulong)in_RSI[1].sum_violation_2 & 0x100) == 0) ||
         (((ulong)in_RSI[1].sum_violation_2 & 1) == 0)) ||
        (((ulong)in_RSI[1].sum_violation_2 & 0x10000) == 0)) ||
       ((((ulong)in_RSI[1].sum_violation_2 & 0x100000000) == 0 ||
        (((ulong)in_RSI[1].sum_violation_2 & 0x1000000) == 0)))) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool checkKkt(const State& state, KktInfo& info) {
  if (state.numCol == 0) {
    std::cout << "KKT warning: empty problem" << std::endl;
    return true;
  }

  std::cout << std::endl;

  checkPrimalBounds(state, info.rules[KktCondition::kColBounds]);
  checkPrimalFeasMatrix(state, info.rules[KktCondition::kPrimalFeasibility]);
  checkDualFeasibility(state, info.rules[KktCondition::kDualFeasibility]);
  checkComplementarySlackness(
      state, info.rules[KktCondition::kComplementarySlackness]);
  checkStationarityOfLagrangian(
      state, info.rules[KktCondition::kStationarityOfLagrangian]);
  checkBasicFeasibleSolution(state,
                             info.rules[KktCondition::kBasicFeasibleSolution]);

  assert(info.rules.size() == 6);

  info.pass_col_bounds = info.rules[KktCondition::kColBounds].violated == 0;
  info.pass_primal_feas_matrix =
      info.rules[KktCondition::kPrimalFeasibility].violated == 0;
  info.pass_dual_feas =
      info.rules[KktCondition::kDualFeasibility].violated == 0;
  info.pass_comp_slackness =
      info.rules[KktCondition::kComplementarySlackness].violated == 0;
  info.pass_st_of_L =
      info.rules[KktCondition::kStationarityOfLagrangian].violated == 0;
  info.pass_bfs =
      info.rules[KktCondition::kBasicFeasibleSolution].violated == 0;

  if (info.pass_primal_feas_matrix && info.pass_col_bounds &&
      info.pass_dual_feas && info.pass_comp_slackness && info.pass_st_of_L)
    return true;

  return false;
}